

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.h
# Opt level: O1

void delete_prefix<loc_rib_data>(node<loc_rib_data> *prefix,bool is_delete_child_prefix)

{
  node<loc_rib_data> *pnVar1;
  byte bVar2;
  node<loc_rib_data> *prefix_00;
  
  do {
    bVar2 = is_delete_child_prefix;
    prefix_00 = prefix;
    prefix_00->is_prefix = false;
    if (prefix_00->data == (loc_rib_data *)0x0) {
      prefix_00->data = (loc_rib_data *)0x0;
    }
    if ((bVar2 & 1) == 0) {
      if (prefix_00->node_1 != (node<loc_rib_data> *)0x0) {
        return;
      }
      if (prefix_00->node_0 != (node<loc_rib_data> *)0x0) {
        return;
      }
      if ((bVar2 & 1) == 0) {
LAB_001055b6:
        if (prefix_00->is_prefix == false) {
          do {
            pnVar1 = prefix_00->parent;
            if (pnVar1 == (node<loc_rib_data> *)0x0) {
              return;
            }
            if ((pnVar1->node_0 != (node<loc_rib_data> *)0x0) &&
               (pnVar1->node_1 != (node<loc_rib_data> *)0x0)) {
              return;
            }
            (&pnVar1->node_0)[pnVar1->node_1 == prefix_00] = (node<loc_rib_data> *)0x0;
            free(prefix_00);
            prefix_00 = pnVar1;
          } while (pnVar1->is_prefix != true);
        }
        return;
      }
    }
    pnVar1 = prefix_00->node_1;
    if ((pnVar1 == (node<loc_rib_data> *)0x0) ||
       (prefix = pnVar1, is_delete_child_prefix = (bool)1,
       prefix_00->node_0 != (node<loc_rib_data> *)0x0)) {
      if ((bVar2 & 1) == 0) goto LAB_001055b6;
      prefix = prefix_00->node_0;
      is_delete_child_prefix = (bool)1;
      if (prefix == (node<loc_rib_data> *)0x0 || pnVar1 != (node<loc_rib_data> *)0x0) {
        if (((pnVar1 == (node<loc_rib_data> *)0x0) || (((bVar2 ^ 1) & 1) != 0)) ||
           (prefix == (node<loc_rib_data> *)0x0)) goto LAB_001055b6;
        prefix->parent = (node<loc_rib_data> *)0x0;
        prefix_00->node_0 = (node<loc_rib_data> *)0x0;
        delete_prefix<loc_rib_data>(prefix_00,true);
      }
    }
  } while( true );
}

Assistant:

void delete_prefix(node<DATA_TYPE>* prefix, bool is_delete_child_prefix = false){
    prefix->is_prefix = false; // 削除対象のプレフィックスはプレフィックス扱いしない
    if(prefix->data == nullptr){
        free(prefix->data);
        prefix->data = nullptr;
    }
    if(!is_delete_child_prefix and (prefix->node_1 != nullptr or prefix->node_0 != nullptr)){
        return;
    }
    if(is_delete_child_prefix and prefix->node_1 != nullptr and prefix->node_0 == nullptr){
        return delete_prefix(prefix->node_1, true);
    }
    if(is_delete_child_prefix and prefix->node_0 != nullptr and prefix->node_1 == nullptr){
        return delete_prefix(prefix->node_0, true);
    }
    node<DATA_TYPE>* tmp1;
    if(is_delete_child_prefix and prefix->node_1 != nullptr and prefix->node_0 != nullptr){
        tmp1 = prefix->node_0;
        tmp1->parent = nullptr;
        prefix->node_0 = nullptr;
        delete_prefix(prefix, true);
        return delete_prefix(tmp1, true);
    }
    node<DATA_TYPE>* tmp2;
    node<DATA_TYPE>* current = prefix;
    while(!current->is_prefix and current->parent != nullptr and (current->parent->node_0 == nullptr or current->parent->node_1 == nullptr)){
#ifdef TEST_RIB_TREE_TEST_TREE
        printf("Release: %s/%d, %p\n", inet_ntoa(in_addr{.s_addr = htonl(current->prefix)}), current->prefix_len, current);
#endif
        tmp2 = current->parent;
        if(current->parent->node_1 == current){
            current->parent->node_1 = nullptr;
        }else{
            current->parent->node_0 = nullptr;
        }
        free(current);
        current = tmp2;
    }
}